

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O2

string * tyhp_time_gmt_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  allocator<char> local_59;
  string local_58 [32];
  char buf [16];
  time_t now;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  time(&now);
  ptVar1 = localtime(&now);
  if ((uint)ptVar1->tm_wday < 7) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  snprintf(buf,0x10,"%d ",(ulong)(uint)ptVar1->tm_mday);
  std::__cxx11::string::string<std::allocator<char>>(local_58,buf,&local_59);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(local_58);
  if ((uint)ptVar1->tm_mon < 0xc) {
    std::__cxx11::string::append((char *)in_RDI);
  }
  snprintf(buf,0x10,"%d",(ulong)(ptVar1->tm_year + 0x76c));
  std::__cxx11::string::string<std::allocator<char>>(local_58,buf,&local_59);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(local_58);
  snprintf(buf,0x10," %d:%d:%d ",(ulong)(uint)ptVar1->tm_hour,(ulong)(uint)ptVar1->tm_min,
           (ulong)(uint)ptVar1->tm_sec);
  std::__cxx11::string::string<std::allocator<char>>(local_58,buf,&local_59);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::append((char *)in_RDI);
  return in_RDI;
}

Assistant:

string tyhp_time_gmt()
{
	time_t now;
	struct tm *time_now;
	string str_time;

	time(&now);
	time_now = localtime(&now);

	switch(time_now->tm_wday)
	{
		case 0:
			str_time += "Sun, ";
			break;
		case 1:
			str_time += "Mon, ";
			break;
		case 2:
			str_time += "Tue, ";
			break;
		case 3:
			str_time += "Wed, ";
			break;
		case 4:
			str_time += "Thu, ";
			break;
		case 5:
			str_time += "Fri, ";
			break;
		case 6:
			str_time += "Sat, ";
			break;
	}
	char buf[16];
	snprintf(buf, sizeof(buf), "%d ", time_now->tm_mday);
	str_time += string(buf);
	switch(time_now->tm_mon)
	{
		case 0:
			str_time += "Jan ";
			break;
		case 1:
			str_time += "Feb ";
			break;
		case 2:
			str_time += "Mar ";
			break;
		case 3:
			str_time += "Apr ";
			break;
		case 4:
			str_time += "May ";
			break;
		case 5:
			str_time += "Jun ";
			break;
		case 6:
			str_time += "Jul ";
			break;
		case 7:
			str_time += "Aug ";
			break;
		case 8:
			str_time += "Sep ";
			break;
		case 9:
			str_time += "Oct ";
			break;
		case 10:
			str_time += "Nov ";
			break;
		case 11:
			str_time += "Dec ";
			break;
	}
	snprintf(buf, sizeof(buf), "%d", time_now->tm_year + 1900);
	str_time += string(buf);
	snprintf(buf, sizeof(buf), " %d:%d:%d ", time_now->tm_hour, time_now->tm_min, time_now->tm_sec);
	str_time += string(buf);

	str_time += "GMT";

	return str_time;
}